

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_remove_range_closed(roaring_bitmap_t *r,uint32_t min,uint32_t max)

{
  uint8_t uVar1;
  array_container_t *c;
  int32_t iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  array_container_t *run;
  long lVar8;
  uint16_t ikey;
  ushort uVar9;
  long lVar10;
  rle16_t *prVar11;
  int32_t iVar12;
  int iVar13;
  long lVar14;
  array_container_t *array;
  uint8_t local_70;
  int local_68;
  uint16_t ikey_00;
  
  if (min <= max) {
    iVar12 = (r->high_low_container).size;
    iVar2 = count_less((r->high_low_container).keys,iVar12,(uint16_t)(min >> 0x10));
    lVar8 = (long)iVar2;
    local_68 = iVar2;
    for (lVar10 = 0; iVar13 = (int)lVar10, lVar8 + lVar10 < (long)iVar12; lVar10 = lVar10 + 1) {
      uVar9 = (r->high_low_container).keys[lVar8 + lVar10];
      if (max >> 0x10 < (uint)uVar9) break;
      uVar3 = 0;
      if (min >> 0x10 == (uint)uVar9) {
        uVar3 = min & 0xffff;
      }
      uVar4 = 0xffff;
      if (max >> 0x10 == (uint)uVar9) {
        uVar4 = max & 0xffff;
      }
      ra_unshare_container_at_index(&r->high_low_container,(short)iVar2 + (short)lVar10);
      run = (array_container_t *)(r->high_low_container).containers[lVar8 + lVar10];
      uVar1 = (r->high_low_container).typecodes[lVar10 + lVar8];
      ikey = (uint16_t)uVar4;
      ikey_00 = (uint16_t)uVar3;
      if (uVar1 == '\x03') {
        iVar12 = run->cardinality;
        lVar14 = (long)iVar12;
        if (lVar14 == 0) {
          run = (array_container_t *)0x0;
          goto LAB_0010f1e2;
        }
        prVar11 = (rle16_t *)run->array;
        if ((uVar3 <= prVar11->value) &&
           ((ushort)(prVar11[lVar14 + -1].length + prVar11[lVar14 + -1].value) <= uVar4))
        goto LAB_0010f1d0;
        uVar5 = rle16_find_run(prVar11,iVar12,ikey_00);
        uVar6 = rle16_find_run(prVar11,iVar12,ikey);
        if ((int)uVar5 < 0) {
          uVar5 = ~uVar5;
LAB_0010f29b:
          if ((int)uVar6 < 0) {
            uVar6 = -uVar6 - 2;
          }
          else {
            uVar9 = prVar11[uVar6].length + prVar11[uVar6].value;
            if (uVar4 < uVar9) {
              prVar11[uVar6].value = ikey + 1;
              prVar11[uVar6].length = uVar9 - (ikey + 1);
              uVar6 = uVar6 - 1;
            }
          }
          if ((int)uVar5 <= (int)uVar6) {
            uVar6 = ~uVar6;
            iVar7 = iVar12 + uVar6;
            iVar13 = uVar5 + uVar6;
            if ((iVar13 != 0 && SCARRY4(uVar5,uVar6) == iVar13 < 0) &&
               (run->capacity < iVar13 + iVar7)) {
              run_container_grow((run_container_t *)run,iVar13 + iVar7,true);
              iVar12 = run->cardinality;
              prVar11 = (rle16_t *)run->array;
            }
            memmove(prVar11 + ((iVar12 - iVar7) + iVar13),prVar11 + (iVar12 - iVar7),
                    (long)iVar7 << 2);
            iVar12 = iVar13 + run->cardinality;
            run->cardinality = iVar12;
          }
        }
        else {
          uVar9 = prVar11[uVar5].value;
          if (uVar3 <= uVar9) goto LAB_0010f29b;
          if ((uint)prVar11[uVar5].length + (uint)uVar9 <= uVar4) {
            prVar11[uVar5].length = ikey_00 + ~uVar9;
            uVar5 = uVar5 + 1;
            goto LAB_0010f29b;
          }
          makeRoomAtIndex((run_container_t *)run,(short)uVar5 + 1);
          prVar11 = (rle16_t *)run->array;
          prVar11[(ulong)uVar5 + 1].value = ikey + 1;
          uVar9 = prVar11[uVar5].value;
          prVar11[(ulong)uVar5 + 1].length = ~ikey + uVar9 + prVar11[uVar5].length;
          prVar11[uVar5].length = ikey_00 + ~uVar9;
          iVar12 = run->cardinality;
        }
        local_70 = '\x03';
        if (0x1ffe < iVar12 * 4) {
          run = (array_container_t *)bitset_container_from_run((run_container_t *)run);
          local_70 = '\x01';
        }
      }
      else if (uVar1 == '\x02') {
        prVar11 = (rle16_t *)run->array;
        iVar12 = run->cardinality;
        uVar3 = count_greater((uint16_t *)prVar11,iVar12,ikey);
        uVar4 = count_less((uint16_t *)prVar11,iVar12 - uVar3,ikey_00);
        if (uVar4 + uVar3 == 0) {
LAB_0010f1d0:
          run = (array_container_t *)0x0;
        }
        else {
          local_70 = '\x02';
          iVar13 = iVar12 - (uVar4 + uVar3);
          if (iVar13 != 0) {
            memmove(&prVar11->value + uVar4,&prVar11->value + (uVar4 + iVar13),(ulong)uVar3 * 2);
            run->cardinality = run->cardinality - iVar13;
          }
        }
      }
      else {
        iVar13 = run->cardinality;
        prVar11 = (rle16_t *)run->array;
        iVar7 = bitset_lenrange_cardinality((uint64_t *)prVar11,uVar3,uVar4 - uVar3);
        iVar13 = iVar13 - iVar7;
        if (iVar13 == 0) goto LAB_0010f1d0;
        bitset_reset_range((uint64_t *)prVar11,uVar3,uVar4 + 1);
        run->cardinality = iVar13;
        local_70 = '\x01';
        if (iVar13 < 0x1000) {
          run = array_container_from_bitset((bitset_container_t *)run);
          local_70 = '\x02';
        }
      }
LAB_0010f1e2:
      c = (array_container_t *)(r->high_low_container).containers[lVar8 + lVar10];
      if (run != c) {
        container_free(c,(r->high_low_container).typecodes[lVar10 + lVar8]);
      }
      if (run != (array_container_t *)0x0) {
        ra_replace_key_and_container_at_index
                  (&r->high_low_container,local_68,(r->high_low_container).keys[lVar8 + lVar10],run,
                   local_70);
        local_68 = local_68 + 1;
      }
      iVar12 = (r->high_low_container).size;
    }
    if (local_68 < iVar2 + iVar13) {
      ra_shift_tail(&r->high_low_container,(iVar12 - iVar2) - iVar13,(local_68 - iVar2) - iVar13);
      return;
    }
  }
  return;
}

Assistant:

void roaring_bitmap_remove_range_closed(roaring_bitmap_t *r, uint32_t min, uint32_t max) {
    if (min > max) {
        return;
    }

    roaring_array_t *ra = &r->high_low_container;

    uint32_t min_key = min >> 16;
    uint32_t max_key = max >> 16;

    int32_t src = count_less(ra->keys, ra->size, min_key);
    int32_t dst = src;
    while (src < ra->size && ra->keys[src] <= max_key) {
        uint32_t container_min = (min_key == ra->keys[src]) ? (min & 0xffff) : 0;
        uint32_t container_max = (max_key == ra->keys[src]) ? (max & 0xffff) : 0xffff;
        ra_unshare_container_at_index(ra, src);
        container_t *new_container;
        uint8_t new_type;
        new_container = container_remove_range(ra->containers[src],
                                               ra->typecodes[src],
                                               container_min, container_max,
                                               &new_type);
        if (new_container != ra->containers[src]) {
            container_free(ra->containers[src],
                           ra->typecodes[src]);
        }
        if (new_container) {
            ra_replace_key_and_container_at_index(ra, dst, ra->keys[src],
                                                  new_container, new_type);
            dst++;
        }
        src++;
    }
    if (src > dst) {
        ra_shift_tail(ra, ra->size - src, dst - src);
    }
}